

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_observer.hpp
# Opt level: O2

void __thiscall
afsm::test::test_fsm_observer::
state_cleared<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::simple_query::fetch_data,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>>
          (test_fsm_observer *this,
          inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
          *param_1,state<afsm::test::connection_fsm_def::transaction::simple_query::fetch_data,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                   *param_2)

{
  ostream *poVar1;
  string local_50;
  string local_30;
  
  poVar1 = psst::operator<<((ostream *)&std::cerr,red|bright);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0x11;
  poVar1 = std::operator<<(poVar1,0x2a);
  poVar1 = std::operator<<(poVar1,"*");
  poVar1 = psst::operator<<(poVar1,clear);
  poVar1 = std::operator<<(poVar1,0x20);
  poVar1 = std::operator<<(poVar1,": State cleared ");
  psst::util::demangle<afsm::test::connection_fsm_def::transaction::simple_query::fetch_data>();
  get_name_components_after(&local_30,&local_50,&this->def_name);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void
    state_cleared(FSM const&, State const&) const noexcept
    {
        using ::psst::ansi_color;
        using ::psst::util::demangle;
        ::std::cerr
             << (ansi_color::red | ansi_color::bright)
             << ::std::setw(event_name_width) << ::std::setfill('*')
             << "*" << ansi_color::clear  << ::std::setfill(' ')
             << ": State cleared "
             << get_name_components_after(
                 demangle< typename State::state_definition_type >(),
                 def_name) <<"\n";
    }